

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall chatra::Package::Package(Package *this,RuntimeImp *runtime,Reader *r)

{
  (this->super_PackageInfo).interface.
  super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PackageInfo).interface.
  super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PackageInfo).handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PackageInfo).handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PackageInfo).scripts.
  super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PackageInfo).handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PackageInfo).scripts.
  super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PackageInfo).scripts.
  super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_IdType<chatra::PackageId,_chatra::Package>).pool =
       (IdPool<chatra::PackageId,_chatra::Package> *)0x0;
  (this->super_IdType<chatra::PackageId,_chatra::Package>).id = 0xffffffffffffffff;
  (this->super_IClassFinder)._vptr_IClassFinder = (_func_int **)&PTR__Package_00246250;
  (this->super_PackageContext)._vptr_PackageContext = (_func_int **)&PTR__Package_002462a0;
  this->runtime = runtime;
  this->initialized = (__atomic_base<bool>)0x0;
  this->temporaryInitialized = false;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->scope)._M_t.super___uniq_ptr_impl<chatra::Scope,_std::default_delete<chatra::Scope>_>._M_t.
  super__Tuple_impl<0UL,_chatra::Scope_*,_std::default_delete<chatra::Scope>_>.
  super__Head_base<0UL,_chatra::Scope_*,_false>._M_head_impl = (Scope *)0x0;
  (this->lines).
  super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::shared_ptr<chatra::Line>,_std::allocator<std::shared_ptr<chatra::Line>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->fromHost = false;
  this->grouped = false;
  this->hasDefOperator = false;
  this->lockNode = (atomic_flag)0x0;
  *(undefined8 *)
   ((long)&(this->threadsWaitingForNode).
           super__Vector_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->threadsWaitingForNode).
           super__Vector_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->threadsWaitingForNode).
  super__Vector_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threadsWaitingForNode).
  super__Vector_base<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->node).super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->node).super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->instances)._M_h._M_buckets = &(this->instances)._M_h._M_single_bucket;
  (this->instances)._M_h._M_bucket_count = 1;
  (this->instances)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->instances)._M_h._M_element_count = 0;
  (this->instances)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->instances)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->instances)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->clPackage)._M_t.super___uniq_ptr_impl<chatra::Class,_std::default_delete<chatra::Class>_>.
  _M_t.super__Tuple_impl<0UL,_chatra::Class_*,_std::default_delete<chatra::Class>_>.
  super__Head_base<0UL,_chatra::Class_*,_false>._M_head_impl = (Class *)0x0;
  (this->classes).classes.super__Fwd_list_base<chatra::Class,_std::allocator<chatra::Class>_>.
  _M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
  (this->classes).byName._M_h._M_buckets = &(this->classes).byName._M_h._M_single_bucket;
  (this->classes).byName._M_h._M_bucket_count = 1;
  (this->classes).byName._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->classes).byName._M_h._M_element_count = 0;
  (this->classes).byName._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->classes).byName._M_h._M_rehash_policy._M_next_resize = 0;
  (this->classes).byName._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->imports)._M_h._M_buckets = &(this->imports)._M_h._M_single_bucket;
  (this->imports)._M_h._M_bucket_count = 1;
  (this->imports)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->imports)._M_h._M_element_count = 0;
  (this->imports)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->imports)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->imports)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->importsByName)._M_h._M_buckets = &(this->importsByName)._M_h._M_single_bucket;
  (this->importsByName)._M_h._M_bucket_count = 1;
  (this->importsByName)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->importsByName)._M_h._M_element_count = 0;
  (this->importsByName)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->anonymousImports).super__Vector_base<chatra::Package_*,_std::allocator<chatra::Package_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->anonymousImports).super__Vector_base<chatra::Package_*,_std::allocator<chatra::Package_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->anonymousImports).super__Vector_base<chatra::Package_*,_std::allocator<chatra::Package_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->importsByName)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->importsByName)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Package::Package(RuntimeImp& runtime, Reader& r) noexcept : runtime(runtime) {
	(void)r;
}